

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::SkipMessage(CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  bool bVar3;
  uint32 tag;
  
  while( true ) {
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar1 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    bVar2 = (tag & 7) == 4 || tag == 0;
    if (bVar2) break;
    bVar3 = SkipField(input,tag);
    if (!bVar3) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input) {
  while(true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag)) return false;
  }
}